

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O0

void * chck_pool_iter(chck_pool *pool,size_t *iter,_Bool reverse)

{
  _Bool _Var1;
  bool bVar2;
  chck_pool *local_40;
  _Bool mapped;
  void *current;
  _Bool reverse_local;
  size_t *iter_local;
  chck_pool *pool_local;
  
  if ((pool != (chck_pool *)0x0) && (iter != (size_t *)0x0)) {
    if ((pool->items).member == 0) {
      pool_local = (chck_pool *)0x0;
    }
    else {
      do {
        _Var1 = pool_is_mapped(pool,*iter);
        local_40 = (chck_pool *)pool_buffer_iter(&pool->items,iter,reverse);
        if (!_Var1) {
          local_40 = (chck_pool *)0x0;
        }
        bVar2 = false;
        if (local_40 == (chck_pool *)0x0) {
          bVar2 = *iter < (pool->map).used / (pool->map).member;
        }
      } while (bVar2);
      pool_local = local_40;
    }
    return pool_local;
  }
  __assert_fail("pool && iter",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c",
                0x19c,"void *chck_pool_iter(const struct chck_pool *, size_t *, _Bool)");
}

Assistant:

void*
chck_pool_iter(const struct chck_pool *pool, size_t *iter, bool reverse)
{
   assert(pool && iter);

   if (!pool->items.member)
      return NULL;

   void *current = NULL;
   do {
      const bool mapped = pool_is_mapped(pool, *iter);
      current = pool_buffer_iter(&pool->items, iter, reverse);
      current = (mapped ? current : NULL);
   } while (!current && *iter < pool->map.used / pool->map.member);

   return current;
}